

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceFinder.hh
# Opt level: O3

void __thiscall ResourceFinder::~ResourceFinder(ResourceFinder *this)

{
  ~ResourceFinder(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

~ResourceFinder() override = default;